

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O0

int __thiscall Debugger::FuzzyMatchFileName(Debugger *this,string *chunkName,string *fileName)

{
  char cVar1;
  char cVar2;
  unsigned_long uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  reference end;
  ulong uVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  unsigned_long *puVar9;
  char *pcVar10;
  char cNextChar;
  int cNextIndex;
  char cLastChar;
  size_t cLastindex;
  char fChar;
  int iStack_68;
  char cChar;
  int i;
  int matchProcess;
  int maxMatchSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  size_t fileExtSize;
  size_t chunkExtSize;
  size_type fileSize;
  size_type chunkSize;
  string *fileName_local;
  string *chunkName_local;
  Debugger *this_local;
  
  chunkSize = (size_type)fileName;
  fileName_local = chunkName;
  chunkName_local = (string *)this;
  fileSize = std::__cxx11::string::size();
  chunkExtSize = std::__cxx11::string::size();
  fileExtSize = 0;
  __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0;
  pvVar8 = &this->manager->extNames;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(pvVar8);
  ext = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(pvVar8);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&ext), bVar4) {
    end = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end1);
    bVar4 = EndWith(fileName_local,end);
    if ((bVar4) && (uVar7 = std::__cxx11::string::size(), fileExtSize < uVar7)) {
      fileExtSize = std::__cxx11::string::size();
    }
    bVar4 = EndWith((string *)chunkSize,end);
    if ((bVar4) &&
       (pvVar8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)std::__cxx11::string::size(), __range1 < pvVar8)) {
      __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)std::__cxx11::string::size();
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  fileSize = fileSize - fileExtSize;
  chunkExtSize = chunkExtSize - (long)__range1;
  puVar9 = std::min<unsigned_long>(&fileSize,&chunkExtSize);
  uVar3 = *puVar9;
  iStack_68 = 1;
  cLastindex._4_4_ = 1;
  do {
    if (cLastindex._4_4_ == (int)uVar3) {
      return iStack_68;
    }
    pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)fileName_local);
    cVar1 = *pcVar10;
    pcVar10 = (char *)std::__cxx11::string::operator[](chunkSize);
    cVar2 = *pcVar10;
    if (cVar1 != cVar2) {
      iVar5 = tolower((int)cVar1);
      iVar6 = tolower((int)cVar2);
      if (iVar5 != iVar6) {
        if (cVar1 == '.') {
          if (fileSize <= (fileSize - (long)cLastindex._4_4_) + 1) {
            return 0;
          }
          pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)fileName_local);
          if ((*pcVar10 != '/') && (*pcVar10 != '\\')) {
            return 0;
          }
          if (((int)fileSize - cLastindex._4_4_) + -1 < 0) {
            return iStack_68;
          }
          pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)fileName_local);
          if ((*pcVar10 != '/') && (*pcVar10 != '\\')) {
            return 0;
          }
          cLastindex._4_4_ = cLastindex._4_4_ + 1;
          chunkExtSize = chunkExtSize + 2;
        }
        else {
          if ((cVar1 != '/') && (cVar1 != '\\')) {
            return 0;
          }
          if ((cVar2 == '/') || (cVar2 == '\\')) {
            iStack_68 = iStack_68 + 1;
          }
          else {
            chunkExtSize = chunkExtSize + 1;
          }
        }
      }
    }
    cLastindex._4_4_ = cLastindex._4_4_ + 1;
  } while( true );
}

Assistant:

int Debugger::FuzzyMatchFileName(const std::string &chunkName, const std::string &fileName) const {
	auto chunkSize = chunkName.size();
	auto fileSize = fileName.size();


	std::size_t chunkExtSize = 0;
	std::size_t fileExtSize = 0;
	// trim 掉后缀
	for (const auto &ext: manager->extNames) {
		if (EndWith(chunkName, ext)) {
			if (ext.size() > chunkExtSize) {
				chunkExtSize = ext.size();
			}
		}

		if (EndWith(fileName, ext)) {
			if (ext.size() > fileExtSize) {
				fileExtSize = ext.size();
			}
		}
	}

	chunkSize -= chunkExtSize;
	fileSize -= fileExtSize;

	// 我们用chunkname去匹配filename
	int maxMatchSize = static_cast<int>(std::min(chunkSize, fileSize));

	int matchProcess = 1;

	for (int i = 1; i != maxMatchSize; i++) {
		char cChar = chunkName[chunkSize - i];
		char fChar = fileName[fileSize - i];

		if (cChar != fChar) {
			// 以下匹配顺序是有意义的，不要轻易改变

			if (::tolower(cChar) == ::tolower(fChar)) {
				continue;
			}

			// 认为来自编辑器的路径不会是相对路径
			// chunkname有可能是(./aaaa)也可能是(aaa/./bbb)
			// 并不匹配(../)的情况
			// 因为 ../的路径意义并不唯一
			if (cChar == '.') {
				std::size_t cLastindex = chunkSize - i + 1;

				if (cLastindex >= chunkSize) {
					matchProcess = 0;
					break;
				}

				char cLastChar = chunkName[cLastindex];
				if (cLastChar != '/' && cLastChar != '\\') {
					matchProcess = 0;
					break;
				}

				// 该值可能为负数
				int cNextIndex = static_cast<int>(chunkSize) - i - 1;
				if (cNextIndex < 0) {
					// 匹配已经完毕
					break;
				}

				char cNextChar = chunkName[cNextIndex];

				// 那chunkname 就是 aaa./bbbb 那就不匹配
				if (cNextChar != '/' && cNextChar != '\\') {
					matchProcess = 0;
					break;
				}

				// 这里会消耗掉 next的匹配
				i++;

				// 这里是指保持下一次循环时fChar不变
				fileSize += 2;
				continue;
			}

			if (cChar == '/' || cChar == '\\') {
				if (fChar == '/' || fChar == '\\') {
					matchProcess++;
					continue;
				}
				// 一些人会写出 require './aaaa' 这种代码
				// 导致lua程序 的chunkname 给的是 .\\/aaaa.lua


				//保持fChar 下次循环时不变
				fileSize++;
				continue;
			}

			// 那就是不匹配
			matchProcess = 0;
			break;
		}
	}

	return matchProcess;
}